

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void ws_listener_accept(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  nng_err result;
  _Bool _Var1;
  void *item;
  
  nni_aio_reset(aio);
  mtx = (nni_mtx *)((long)arg + 0x60);
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0x111) == '\x01') {
    result = NNG_ECLOSED;
  }
  else {
    if (*(char *)((long)arg + 0x110) != '\0') {
      item = nni_list_first((nni_list *)((long)arg + 0xc0));
      if (item != (void *)0x0) {
        nni_list_remove((nni_list *)((long)arg + 0xc0),item);
        nni_mtx_unlock(mtx);
        nni_aio_set_output(aio,0,item);
        nni_aio_finish(aio,NNG_OK,0);
        return;
      }
      _Var1 = nni_aio_start(aio,ws_accept_cancel,arg);
      if (_Var1) {
        nni_list_append((nni_list *)((long)arg + 0xf0),aio);
      }
      goto LAB_0012888b;
    }
    result = NNG_ESTATE;
  }
  nni_aio_finish_error(aio,result);
LAB_0012888b:
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
ws_listener_accept(void *arg, nni_aio *aio)
{
	nni_ws_listener *l = arg;
	nni_ws          *ws;

	nni_aio_reset(aio);
	nni_mtx_lock(&l->mtx);
	if (l->closed) {
		nni_aio_finish_error(aio, NNG_ECLOSED);
		nni_mtx_unlock(&l->mtx);
		return;
	}
	if (!l->started) {
		nni_aio_finish_error(aio, NNG_ESTATE);
		nni_mtx_unlock(&l->mtx);
		return;
	}
	if ((ws = nni_list_first(&l->pend)) != NULL) {
		nni_list_remove(&l->pend, ws);
		nni_mtx_unlock(&l->mtx);
		nni_aio_set_output(aio, 0, ws);
		nni_aio_finish(aio, 0, 0);
		return;
	}
	if (!nni_aio_start(aio, ws_accept_cancel, l)) {
		nni_mtx_unlock(&l->mtx);
		return;
	}
	nni_list_append(&l->aios, aio);
	nni_mtx_unlock(&l->mtx);
}